

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkAllocationCallbackUtil.cpp
# Opt level: O1

void vk::validateAllocationCallbacks
               (AllocationCallbackRecorder *recorder,AllocationCallbackValidationResults *results)

{
  pointer *ppAVar1;
  void **ppvVar2;
  anon_union_40_4_36e40bc3_for_data *__k;
  pointer *ppAVar3;
  AllocationCallbackRecord *pAVar4;
  size_t *psVar5;
  char cVar6;
  Type TVar7;
  ulong uVar8;
  void *pvVar9;
  mapped_type_conflict1 mVar10;
  iterator __position;
  size_t sVar11;
  size_t sVar12;
  void *pvVar13;
  pointer pAVar14;
  pointer pAVar15;
  undefined4 uVar16;
  pointer pAVar17;
  pointer pAVar18;
  VkSystemAllocationScope *pVVar19;
  mapped_type_conflict1 *pmVar20;
  _Base_ptr p_Var21;
  long lVar22;
  size_t sVar23;
  _Base_ptr p_Var24;
  _Rb_tree_header *p_Var25;
  pointer pAVar26;
  Block *pBVar27;
  iterator iVar28;
  _Rb_tree_header *p_Var29;
  ulong uVar30;
  bool bVar31;
  vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
  allocations;
  map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ptrToSlotIndex;
  value_type local_d8;
  vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
  *local_a0;
  vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
  local_98;
  pointer local_80;
  Block *local_78;
  _Rb_tree<void_*,_std::pair<void_*const,_unsigned_long>,_std::_Select1st<std::pair<void_*const,_unsigned_long>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  local_70;
  size_t (*local_40) [5];
  ulong local_38;
  
  local_98.
  super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_70._M_impl.super__Rb_tree_header._M_header;
  local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_38 = (recorder->m_records).m_blockSize;
  pBVar27 = (recorder->m_records).m_first;
  local_70._M_impl.super__Rb_tree_header._M_header._M_right =
       local_70._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((pBVar27 != (recorder->m_records).m_last) ||
     (pAVar26 = local_98.
                super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                ._M_impl.super__Vector_impl_data._M_start,
     pAVar14 = local_98.
               super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
               ._M_impl.super__Vector_impl_data._M_start,
     pAVar15 = local_98.
               super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
               ._M_impl.super__Vector_impl_data._M_finish,
     (recorder->m_records).m_numElements % local_38 != 0)) {
    local_a0 = &results->violations;
    local_40 = results->internalAllocationTotal;
    uVar30 = 0;
    do {
      p_Var29 = &local_70._M_impl.super__Rb_tree_header;
      pAVar4 = pBVar27->elements + uVar30;
      TVar7 = pBVar27->elements[uVar30].type;
      if (TVar7 == TYPE_INTERNAL_ALLOCATION) {
        pVVar19 = &(pAVar4->data).internalAllocation.scope;
      }
      else if (TVar7 == TYPE_REALLOCATION) {
        pVVar19 = &(pAVar4->data).reallocation.scope;
      }
      else if (TVar7 == TYPE_ALLOCATION) {
        pVVar19 = &(pAVar4->data).allocation.scope;
      }
      else {
        pVVar19 = &(pAVar4->data).internalAllocation.scope;
        if (TVar7 != TYPE_INTERNAL_FREE) {
          pVVar19 = (VkSystemAllocationScope *)0x0;
        }
      }
      if ((pVVar19 != (VkSystemAllocationScope *)0x0) &&
         (VK_SYSTEM_ALLOCATION_SCOPE_INSTANCE < *pVVar19)) {
        local_d8.record.type = pAVar4->type;
        local_d8.record._4_4_ = *(undefined4 *)&pAVar4->field_0x4;
        local_d8.record.data.allocation.size = (pAVar4->data).allocation.size;
        local_d8.record.data.allocation.alignment = (pAVar4->data).allocation.alignment;
        local_d8.record.data.reallocation.alignment = (pAVar4->data).reallocation.alignment;
        local_d8.record.data.allocation.returnedPtr = (pAVar4->data).allocation.returnedPtr;
        local_d8.record.data.reallocation.returnedPtr = (pAVar4->data).reallocation.returnedPtr;
        local_d8.isLive = true;
        local_d8._49_3_ = 0;
        iVar28._M_current =
             (results->violations).
             super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar28._M_current ==
            (results->violations).
            super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
          ::_M_realloc_insert<vk::AllocationCallbackViolation>
                    (local_a0,iVar28,(AllocationCallbackViolation *)&local_d8);
        }
        else {
          *(ulong *)&(iVar28._M_current)->reason = CONCAT44(local_d8._52_4_,5);
          ((iVar28._M_current)->record).data.allocation.returnedPtr =
               local_d8.record.data.allocation.returnedPtr;
          ((iVar28._M_current)->record).data.reallocation.returnedPtr =
               local_d8.record.data.reallocation.returnedPtr;
          ((iVar28._M_current)->record).data.allocation.alignment =
               local_d8.record.data.allocation.alignment;
          ((iVar28._M_current)->record).data.reallocation.alignment =
               local_d8.record.data.reallocation.alignment;
          ((iVar28._M_current)->record).type = local_d8.record.type;
          *(undefined4 *)&((iVar28._M_current)->record).field_0x4 = local_d8.record._4_4_;
          ((iVar28._M_current)->record).data.allocation.size = local_d8.record.data.allocation.size;
          ppAVar1 = &(results->violations).
                     super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppAVar1 = *ppAVar1 + 1;
        }
      }
      local_78 = pBVar27;
      if ((pAVar4->type < TYPE_FREE) &&
         (uVar8 = *(ulong *)((long)&pAVar4->data + (ulong)(pAVar4->type & TYPE_REALLOCATION) * 8 + 8
                            ), (uVar8 & uVar8 - 1) != 0)) {
        local_d8.record.type = pAVar4->type;
        local_d8.record._4_4_ = *(undefined4 *)&pAVar4->field_0x4;
        local_d8.record.data.allocation.size = (pAVar4->data).allocation.size;
        local_d8.record.data.allocation.alignment = (pAVar4->data).allocation.alignment;
        local_d8.record.data.reallocation.alignment = (pAVar4->data).reallocation.alignment;
        local_d8.record.data.allocation.returnedPtr = (pAVar4->data).allocation.returnedPtr;
        local_d8.record.data.reallocation.returnedPtr = (pAVar4->data).reallocation.returnedPtr;
        local_d8.isLive = true;
        local_d8._49_3_ = 0;
        iVar28._M_current =
             (results->violations).
             super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar28._M_current ==
            (results->violations).
            super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
          ::_M_realloc_insert<vk::AllocationCallbackViolation>
                    (local_a0,iVar28,(AllocationCallbackViolation *)&local_d8);
        }
        else {
          *(ulong *)&(iVar28._M_current)->reason = CONCAT44(local_d8._52_4_,7);
          ((iVar28._M_current)->record).data.allocation.returnedPtr =
               local_d8.record.data.allocation.returnedPtr;
          ((iVar28._M_current)->record).data.reallocation.returnedPtr =
               local_d8.record.data.reallocation.returnedPtr;
          ((iVar28._M_current)->record).data.allocation.alignment =
               local_d8.record.data.allocation.alignment;
          ((iVar28._M_current)->record).data.reallocation.alignment =
               local_d8.record.data.reallocation.alignment;
          ((iVar28._M_current)->record).type = local_d8.record.type;
          *(undefined4 *)&((iVar28._M_current)->record).field_0x4 = local_d8.record._4_4_;
          ((iVar28._M_current)->record).data.allocation.size = local_d8.record.data.allocation.size;
          ppAVar1 = &(results->violations).
                     super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppAVar1 = *ppAVar1 + 1;
        }
      }
      pAVar14 = local_98.
                super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pAVar26 = local_98.
                super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                ._M_impl.super__Vector_impl_data._M_start;
      switch(pAVar4->type) {
      case TYPE_ALLOCATION:
        pvVar9 = (pAVar4->data).allocation.returnedPtr;
        p_Var21 = &p_Var29->_M_header;
        p_Var24 = local_70._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (pvVar9 != (void *)0x0) {
          for (; p_Var24 != (_Base_ptr)0x0;
              p_Var24 = (&p_Var24->_M_left)[*(void **)(p_Var24 + 1) < pvVar9]) {
            if (*(void **)(p_Var24 + 1) >= pvVar9) {
              p_Var21 = p_Var24;
            }
          }
          p_Var24 = &p_Var29->_M_header;
          if (((_Rb_tree_header *)p_Var21 != p_Var29) &&
             (p_Var24 = p_Var21, pvVar9 < *(void **)(p_Var21 + 1))) {
            p_Var24 = &p_Var29->_M_header;
          }
          ppvVar2 = &(pAVar4->data).allocation.returnedPtr;
          if ((_Rb_tree_header *)p_Var24 == p_Var29) {
            pmVar20 = std::
                      map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                      ::operator[]((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                                    *)&local_70,ppvVar2);
            *pmVar20 = ((long)pAVar14 - (long)pAVar26 >> 3) * 0x6db6db6db6db6db7;
            local_d8.record.type = pAVar4->type;
            local_d8.record._4_4_ = *(undefined4 *)&pAVar4->field_0x4;
            local_d8.record.data.allocation.size = (pAVar4->data).allocation.size;
            local_d8.record.data.allocation.alignment = (pAVar4->data).allocation.alignment;
            local_d8.record.data.reallocation.alignment = (pAVar4->data).reallocation.alignment;
            local_d8.record.data.allocation.returnedPtr = (pAVar4->data).allocation.returnedPtr;
            local_d8.record.data.reallocation.returnedPtr = (pAVar4->data).reallocation.returnedPtr;
            local_d8.isLive = true;
            std::
            vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
            ::push_back(&local_98,&local_d8);
          }
          else {
            pmVar20 = std::
                      map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                      ::operator[]((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                                    *)&local_70,ppvVar2);
            mVar10 = *pmVar20;
            cVar6 = local_98.
                    super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                    ._M_impl.super__Vector_impl_data._M_start[mVar10].isLive;
            pAVar26 = local_98.
                      super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                      ._M_impl.super__Vector_impl_data._M_start;
joined_r0x00a35527:
            if (cVar6 == '\0') {
              pAVar26 = pAVar26 + mVar10;
              pAVar26->isLive = true;
              uVar16 = *(undefined4 *)&pAVar4->field_0x4;
              sVar23 = (pAVar4->data).allocation.size;
              sVar11 = (pAVar4->data).allocation.alignment;
              sVar12 = (pAVar4->data).reallocation.alignment;
              pvVar9 = (pAVar4->data).allocation.returnedPtr;
              pvVar13 = (pAVar4->data).reallocation.returnedPtr;
              (pAVar26->record).type = pAVar4->type;
              *(undefined4 *)&(pAVar26->record).field_0x4 = uVar16;
              (pAVar26->record).data.allocation.size = sVar23;
              (pAVar26->record).data.allocation.alignment = sVar11;
              (pAVar26->record).data.reallocation.alignment = sVar12;
              (pAVar26->record).data.allocation.returnedPtr = pvVar9;
              (pAVar26->record).data.reallocation.returnedPtr = pvVar13;
            }
          }
        }
        break;
      case TYPE_REALLOCATION:
        __k = &pAVar4->data;
        p_Var21 = &p_Var29->_M_header;
        if (local_70._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          p_Var24 = local_70._M_impl.super__Rb_tree_header._M_header._M_parent;
          do {
            bVar31 = *(ulong *)(p_Var24 + 1) < (__k->allocation).size;
            if (!bVar31) {
              p_Var21 = p_Var24;
            }
            p_Var24 = (&p_Var24->_M_left)[bVar31];
          } while (p_Var24 != (_Base_ptr)0x0);
        }
        p_Var24 = &p_Var29->_M_header;
        if (((_Rb_tree_header *)p_Var21 != p_Var29) &&
           (p_Var24 = p_Var21, (__k->allocation).size < *(ulong *)(p_Var21 + 1))) {
          p_Var24 = &p_Var29->_M_header;
        }
        if ((_Rb_tree_header *)p_Var24 == p_Var29) {
          if ((__k->allocation).size != 0) {
            local_d8.record.type = pAVar4->type;
            local_d8.record._4_4_ = *(undefined4 *)&pAVar4->field_0x4;
            local_d8.record.data.allocation.size = (pAVar4->data).allocation.size;
            local_d8.record.data.allocation.alignment = (pAVar4->data).allocation.alignment;
            local_d8.record.data.reallocation.alignment = (pAVar4->data).reallocation.alignment;
            local_d8.record.data.allocation.returnedPtr = (pAVar4->data).allocation.returnedPtr;
            local_d8.record.data.reallocation.returnedPtr = (pAVar4->data).reallocation.returnedPtr;
            local_d8.isLive = true;
            local_d8._49_3_ = 0;
            iVar28._M_current =
                 (results->violations).
                 super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar28._M_current ==
                (results->violations).
                super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
              ::_M_realloc_insert<vk::AllocationCallbackViolation>
                        (local_a0,iVar28,(AllocationCallbackViolation *)&local_d8);
            }
            else {
              *(ulong *)&(iVar28._M_current)->reason = CONCAT44(local_d8._52_4_,2);
              ((iVar28._M_current)->record).data.allocation.returnedPtr =
                   local_d8.record.data.allocation.returnedPtr;
              ((iVar28._M_current)->record).data.reallocation.returnedPtr =
                   local_d8.record.data.reallocation.returnedPtr;
              ((iVar28._M_current)->record).data.allocation.alignment =
                   local_d8.record.data.allocation.alignment;
              ((iVar28._M_current)->record).data.reallocation.alignment =
                   local_d8.record.data.reallocation.alignment;
              ((iVar28._M_current)->record).type = local_d8.record.type;
              *(undefined4 *)&((iVar28._M_current)->record).field_0x4 = local_d8.record._4_4_;
              ((iVar28._M_current)->record).data.allocation.size =
                   local_d8.record.data.allocation.size;
              ppAVar1 = &(results->violations).
                         super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppAVar1 = *ppAVar1 + 1;
            }
          }
          pAVar14 = local_98.
                    super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pAVar26 = local_98.
                    super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pvVar9 = (pAVar4->data).reallocation.returnedPtr;
          p_Var21 = &p_Var29->_M_header;
          p_Var24 = local_70._M_impl.super__Rb_tree_header._M_header._M_parent;
          if (pvVar9 != (void *)0x0) {
            for (; p_Var24 != (_Base_ptr)0x0;
                p_Var24 = (&p_Var24->_M_left)[*(void **)(p_Var24 + 1) < pvVar9]) {
              if (*(void **)(p_Var24 + 1) >= pvVar9) {
                p_Var21 = p_Var24;
              }
            }
            p_Var24 = &p_Var29->_M_header;
            if (((_Rb_tree_header *)p_Var21 != p_Var29) &&
               (p_Var24 = p_Var21, pvVar9 < *(void **)(p_Var21 + 1))) {
              p_Var24 = &p_Var29->_M_header;
            }
            ppvVar2 = &(pAVar4->data).reallocation.returnedPtr;
            if ((_Rb_tree_header *)p_Var24 == p_Var29) {
              pmVar20 = std::
                        map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                        ::operator[]((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                                      *)&local_70,ppvVar2);
              *pmVar20 = ((long)pAVar14 - (long)pAVar26 >> 3) * 0x6db6db6db6db6db7;
              local_d8.record.type = pAVar4->type;
              local_d8.record._4_4_ = *(undefined4 *)&pAVar4->field_0x4;
              local_d8.record.data.allocation.size = (pAVar4->data).allocation.size;
              local_d8.record.data.allocation.alignment = (pAVar4->data).allocation.alignment;
              local_d8.record.data.reallocation.alignment = (pAVar4->data).reallocation.alignment;
              local_d8.record.data.allocation.returnedPtr = (pAVar4->data).allocation.returnedPtr;
              local_d8.record.data.reallocation.returnedPtr =
                   (pAVar4->data).reallocation.returnedPtr;
              local_d8.isLive = true;
              std::
              vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
              ::push_back(&local_98,&local_d8);
            }
            else {
              pmVar20 = std::
                        map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                        ::operator[]((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                                      *)&local_70,ppvVar2);
              mVar10 = *pmVar20;
              local_98.
              super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
              ._M_impl.super__Vector_impl_data._M_start[mVar10].isLive = true;
              uVar16 = *(undefined4 *)&pAVar4->field_0x4;
              sVar23 = (pAVar4->data).allocation.size;
              sVar11 = (pAVar4->data).allocation.alignment;
              sVar12 = (pAVar4->data).reallocation.alignment;
              pvVar9 = (pAVar4->data).allocation.returnedPtr;
              pvVar13 = (pAVar4->data).reallocation.returnedPtr;
              pAVar26 = local_98.
                        super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                        ._M_impl.super__Vector_impl_data._M_start + mVar10;
              (pAVar26->record).type = pAVar4->type;
              *(undefined4 *)&(pAVar26->record).field_0x4 = uVar16;
              (pAVar26->record).data.allocation.size = sVar23;
              psVar5 = &local_98.
                        super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                        ._M_impl.super__Vector_impl_data._M_start[mVar10].record.data.allocation.
                        alignment;
              *psVar5 = sVar11;
              psVar5[1] = sVar12;
              ppvVar2 = &local_98.
                         super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                         ._M_impl.super__Vector_impl_data._M_start[mVar10].record.data.allocation.
                         returnedPtr;
              *ppvVar2 = pvVar9;
              ppvVar2[1] = pvVar13;
            }
          }
        }
        else {
          pmVar20 = std::
                    map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                    ::operator[]((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                                  *)&local_70,&(__k->free).mem);
          pAVar26 = local_98.
                    super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                    ._M_impl.super__Vector_impl_data._M_start + *pmVar20;
          if ((pAVar4->data).allocation.alignment == 0) {
            pAVar26->isLive = false;
          }
          else {
            local_80 = local_98.
                       super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            TVar7 = (pAVar26->record).type;
            if (TVar7 == TYPE_ALLOCATION) {
              lVar22 = 0x10;
LAB_00a35334:
              sVar23 = *(size_t *)((long)&(pAVar26->record).type + lVar22);
            }
            else {
              if (TVar7 == TYPE_REALLOCATION) {
                lVar22 = 0x18;
                goto LAB_00a35334;
              }
              sVar23 = 0;
            }
            if (sVar23 != (pAVar4->data).reallocation.alignment) {
              local_d8.record.type = pAVar4->type;
              local_d8.record._4_4_ = *(undefined4 *)&pAVar4->field_0x4;
              local_d8.record.data.allocation.size = (pAVar4->data).allocation.size;
              local_d8.record.data.allocation.alignment = (pAVar4->data).allocation.alignment;
              local_d8.record.data.reallocation.alignment = (pAVar4->data).reallocation.alignment;
              local_d8.record.data.allocation.returnedPtr = (pAVar4->data).allocation.returnedPtr;
              local_d8.record.data.reallocation.returnedPtr =
                   (pAVar4->data).reallocation.returnedPtr;
              local_d8.isLive = true;
              local_d8._49_3_ = 0;
              iVar28._M_current =
                   (results->violations).
                   super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar28._M_current ==
                  (results->violations).
                  super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                ::_M_realloc_insert<vk::AllocationCallbackViolation>
                          (local_a0,iVar28,(AllocationCallbackViolation *)&local_d8);
              }
              else {
                *(ulong *)&(iVar28._M_current)->reason = CONCAT44(local_d8._52_4_,8);
                ((iVar28._M_current)->record).data.allocation.returnedPtr =
                     local_d8.record.data.allocation.returnedPtr;
                ((iVar28._M_current)->record).data.reallocation.returnedPtr =
                     local_d8.record.data.reallocation.returnedPtr;
                ((iVar28._M_current)->record).data.allocation.alignment =
                     local_d8.record.data.allocation.alignment;
                ((iVar28._M_current)->record).data.reallocation.alignment =
                     local_d8.record.data.reallocation.alignment;
                ((iVar28._M_current)->record).type = local_d8.record.type;
                *(undefined4 *)&((iVar28._M_current)->record).field_0x4 = local_d8.record._4_4_;
                ((iVar28._M_current)->record).data.allocation.size =
                     local_d8.record.data.allocation.size;
                ppAVar1 = &(results->violations).
                           super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppAVar1 = *ppAVar1 + 1;
              }
            }
            pAVar14 = local_98.
                      super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pvVar9 = (pAVar4->data).reallocation.returnedPtr;
            if ((void *)(pAVar4->data).allocation.size == pvVar9) {
              if (pAVar26->isLive == false) {
                local_d8.record.type = pAVar4->type;
                local_d8.record._4_4_ = *(undefined4 *)&pAVar4->field_0x4;
                local_d8.record.data.allocation.size = (pAVar4->data).allocation.size;
                local_d8.record.data.allocation.alignment = (pAVar4->data).allocation.alignment;
                local_d8.record.data.reallocation.alignment = (pAVar4->data).reallocation.alignment;
                local_d8.record.data.allocation.returnedPtr = (pAVar4->data).allocation.returnedPtr;
                local_d8.record.data.reallocation.returnedPtr =
                     (pAVar4->data).reallocation.returnedPtr;
                local_d8.isLive = true;
                local_d8._49_3_ = 0;
                iVar28._M_current =
                     (results->violations).
                     super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (iVar28._M_current ==
                    (results->violations).
                    super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                  ::_M_realloc_insert<vk::AllocationCallbackViolation>
                            (local_a0,iVar28,(AllocationCallbackViolation *)&local_d8);
                }
                else {
                  *(ulong *)&(iVar28._M_current)->reason = CONCAT44(local_d8._52_4_,3);
                  ((iVar28._M_current)->record).data.allocation.returnedPtr =
                       local_d8.record.data.allocation.returnedPtr;
                  ((iVar28._M_current)->record).data.reallocation.returnedPtr =
                       local_d8.record.data.reallocation.returnedPtr;
                  ((iVar28._M_current)->record).data.allocation.alignment =
                       local_d8.record.data.allocation.alignment;
                  ((iVar28._M_current)->record).data.reallocation.alignment =
                       local_d8.record.data.reallocation.alignment;
                  ((iVar28._M_current)->record).type = local_d8.record.type;
                  *(undefined4 *)&((iVar28._M_current)->record).field_0x4 = local_d8.record._4_4_;
                  ((iVar28._M_current)->record).data.allocation.size =
                       local_d8.record.data.allocation.size;
                  ppAVar1 = &(results->violations).
                             super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppAVar1 = *ppAVar1 + 1;
                }
                pAVar26->isLive = true;
              }
              TVar7 = pAVar4->type;
              uVar16 = *(undefined4 *)&pAVar4->field_0x4;
              sVar23 = (pAVar4->data).allocation.size;
              sVar11 = (pAVar4->data).allocation.alignment;
              sVar12 = (pAVar4->data).reallocation.alignment;
              pvVar9 = (pAVar4->data).reallocation.returnedPtr;
              (pAVar26->record).data.allocation.returnedPtr = (pAVar4->data).allocation.returnedPtr;
              (pAVar26->record).data.reallocation.returnedPtr = pvVar9;
              (pAVar26->record).data.allocation.alignment = sVar11;
              (pAVar26->record).data.reallocation.alignment = sVar12;
              (pAVar26->record).type = TVar7;
              *(undefined4 *)&(pAVar26->record).field_0x4 = uVar16;
              (pAVar26->record).data.allocation.size = sVar23;
            }
            else if (pvVar9 != (void *)0x0) {
              pAVar26->isLive = false;
              p_Var24 = &p_Var29->_M_header;
              for (p_Var21 = local_70._M_impl.super__Rb_tree_header._M_header._M_parent;
                  p_Var21 != (_Base_ptr)0x0;
                  p_Var21 = (&p_Var21->_M_left)[*(void **)(p_Var21 + 1) < pvVar9]) {
                if (*(void **)(p_Var21 + 1) >= pvVar9) {
                  p_Var24 = p_Var21;
                }
              }
              p_Var21 = &p_Var29->_M_header;
              if (((_Rb_tree_header *)p_Var24 != p_Var29) &&
                 (p_Var21 = p_Var24, pvVar9 < *(void **)(p_Var24 + 1))) {
                p_Var21 = &p_Var29->_M_header;
              }
              ppvVar2 = &(pAVar4->data).reallocation.returnedPtr;
              if ((_Rb_tree_header *)p_Var21 != p_Var29) {
                pmVar20 = std::
                          map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                          ::operator[]((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                                        *)&local_70,ppvVar2);
                mVar10 = *pmVar20;
                cVar6 = local_80[mVar10].isLive;
                pAVar26 = local_80;
                goto joined_r0x00a35527;
              }
              pmVar20 = std::
                        map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                        ::operator[]((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                                      *)&local_70,ppvVar2);
              *pmVar20 = ((long)pAVar14 - (long)local_80 >> 3) * 0x6db6db6db6db6db7;
              local_d8.record.type = pAVar4->type;
              local_d8.record._4_4_ = *(undefined4 *)&pAVar4->field_0x4;
              local_d8.record.data.allocation.size = (pAVar4->data).allocation.size;
              local_d8.record.data.allocation.alignment = (pAVar4->data).allocation.alignment;
              local_d8.record.data.reallocation.alignment = (pAVar4->data).reallocation.alignment;
              local_d8.record.data.allocation.returnedPtr = (pAVar4->data).allocation.returnedPtr;
              local_d8.record.data.reallocation.returnedPtr =
                   (pAVar4->data).reallocation.returnedPtr;
              local_d8.isLive = true;
              std::
              vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
              ::push_back(&local_98,&local_d8);
            }
          }
        }
        break;
      case TYPE_FREE:
        uVar8 = (pAVar4->data).allocation.size;
        p_Var21 = &p_Var29->_M_header;
        p_Var24 = local_70._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (uVar8 != 0) {
          for (; (_Rb_tree_header *)p_Var24 != (_Rb_tree_header *)0x0;
              p_Var24 = (&p_Var24->_M_left)[*(ulong *)(p_Var24 + 1) < uVar8]) {
            if (*(ulong *)(p_Var24 + 1) >= uVar8) {
              p_Var21 = p_Var24;
            }
          }
          p_Var25 = p_Var29;
          if (((_Rb_tree_header *)p_Var21 != p_Var29) &&
             (p_Var25 = (_Rb_tree_header *)p_Var21,
             uVar8 < ((_Rb_tree_header *)p_Var21)->_M_node_count)) {
            p_Var25 = p_Var29;
          }
          if (p_Var25 == p_Var29) {
            local_d8.record.type = pAVar4->type;
            local_d8.record._4_4_ = *(undefined4 *)&pAVar4->field_0x4;
            local_d8.record.data.allocation.size = (pAVar4->data).allocation.size;
            local_d8.record.data.allocation.alignment = (pAVar4->data).allocation.alignment;
            local_d8.record.data.reallocation.alignment = (pAVar4->data).reallocation.alignment;
            local_d8.record.data.allocation.returnedPtr = (pAVar4->data).allocation.returnedPtr;
            local_d8.record.data.reallocation.returnedPtr = (pAVar4->data).reallocation.returnedPtr;
            local_d8.isLive = true;
            local_d8._49_3_ = 0;
            iVar28._M_current =
                 (results->violations).
                 super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar28._M_current ==
                (results->violations).
                super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
              ::_M_realloc_insert<vk::AllocationCallbackViolation>
                        (local_a0,iVar28,(AllocationCallbackViolation *)&local_d8);
            }
            else {
LAB_00a34f4b:
              *(ulong *)&(iVar28._M_current)->reason = CONCAT44(local_d8._52_4_,local_d8._48_4_);
              ((iVar28._M_current)->record).data.allocation.returnedPtr =
                   local_d8.record.data.allocation.returnedPtr;
              ((iVar28._M_current)->record).data.reallocation.returnedPtr =
                   local_d8.record.data.reallocation.returnedPtr;
              ((iVar28._M_current)->record).data.allocation.alignment =
                   local_d8.record.data.allocation.alignment;
              ((iVar28._M_current)->record).data.reallocation.alignment =
                   local_d8.record.data.reallocation.alignment;
              ((iVar28._M_current)->record).type = local_d8.record.type;
              *(undefined4 *)&((iVar28._M_current)->record).field_0x4 = local_d8.record._4_4_;
              ((iVar28._M_current)->record).data.allocation.size =
                   local_d8.record.data.allocation.size;
              ppAVar1 = &(results->violations).
                         super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppAVar1 = *ppAVar1 + 1;
            }
          }
          else {
            pmVar20 = std::
                      map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                      ::operator[]((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                                    *)&local_70,&(pAVar4->data).free.mem);
            if (local_98.
                super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                ._M_impl.super__Vector_impl_data._M_start[*pmVar20].isLive == true) {
              local_98.
              super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
              ._M_impl.super__Vector_impl_data._M_start[*pmVar20].isLive = false;
            }
            else {
              local_d8.record.type = pAVar4->type;
              local_d8.record._4_4_ = *(undefined4 *)&pAVar4->field_0x4;
              local_d8.record.data.allocation.size = (pAVar4->data).allocation.size;
              local_d8.record.data.allocation.alignment = (pAVar4->data).allocation.alignment;
              local_d8.record.data.reallocation.alignment = (pAVar4->data).reallocation.alignment;
              local_d8.record.data.allocation.returnedPtr = (pAVar4->data).allocation.returnedPtr;
              local_d8.record.data.reallocation.returnedPtr =
                   (pAVar4->data).reallocation.returnedPtr;
              local_d8.isLive = false;
              local_d8._49_3_ = 0;
              iVar28._M_current =
                   (results->violations).
                   super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar28._M_current !=
                  (results->violations).
                  super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00a34f4b;
              std::
              vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
              ::_M_realloc_insert<vk::AllocationCallbackViolation>
                        (local_a0,iVar28,(AllocationCallbackViolation *)&local_d8);
            }
          }
        }
        break;
      case TYPE_INTERNAL_ALLOCATION:
      case TYPE_INTERNAL_FREE:
        if ((pAVar4->data).internalAllocation.type == VK_INTERNAL_ALLOCATION_TYPE_EXECUTABLE) {
          psVar5 = *local_40 + (pAVar4->data).internalAllocation.scope;
          uVar8 = (pAVar4->data).allocation.size;
          if ((pAVar4->type == TYPE_INTERNAL_FREE) &&
             (bVar31 = *psVar5 < uVar8, uVar8 = -uVar8, bVar31)) {
            local_d8.record.type = pAVar4->type;
            local_d8.record._4_4_ = *(undefined4 *)&pAVar4->field_0x4;
            local_d8.record.data.allocation.size = (pAVar4->data).allocation.size;
            local_d8.record.data.allocation.alignment = (pAVar4->data).allocation.alignment;
            local_d8.record.data.reallocation.alignment = (pAVar4->data).reallocation.alignment;
            local_d8.record.data.allocation.returnedPtr = (pAVar4->data).allocation.returnedPtr;
            local_d8.record.data.reallocation.returnedPtr = (pAVar4->data).reallocation.returnedPtr;
            local_d8.isLive = true;
            local_d8._49_3_ = 0;
            iVar28._M_current =
                 (results->violations).
                 super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar28._M_current ==
                (results->violations).
                super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
              ::_M_realloc_insert<vk::AllocationCallbackViolation>
                        (local_a0,iVar28,(AllocationCallbackViolation *)&local_d8);
            }
            else {
              *(ulong *)&(iVar28._M_current)->reason = CONCAT44(local_d8._52_4_,4);
              ((iVar28._M_current)->record).data.allocation.returnedPtr =
                   local_d8.record.data.allocation.returnedPtr;
              ((iVar28._M_current)->record).data.reallocation.returnedPtr =
                   local_d8.record.data.reallocation.returnedPtr;
              ((iVar28._M_current)->record).data.allocation.alignment =
                   local_d8.record.data.allocation.alignment;
              ((iVar28._M_current)->record).data.reallocation.alignment =
                   local_d8.record.data.reallocation.alignment;
              ((iVar28._M_current)->record).type = local_d8.record.type;
              *(undefined4 *)&((iVar28._M_current)->record).field_0x4 = local_d8.record._4_4_;
              ((iVar28._M_current)->record).data.allocation.size =
                   local_d8.record.data.allocation.size;
              ppAVar1 = &(results->violations).
                         super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppAVar1 = *ppAVar1 + 1;
            }
            *psVar5 = 0;
          }
          else {
            *psVar5 = *psVar5 + uVar8;
          }
        }
        else {
          local_d8.record.type = pAVar4->type;
          local_d8.record._4_4_ = *(undefined4 *)&pAVar4->field_0x4;
          local_d8.record.data.allocation.size = (pAVar4->data).allocation.size;
          local_d8.record.data.allocation.alignment = (pAVar4->data).allocation.alignment;
          local_d8.record.data.reallocation.alignment = (pAVar4->data).reallocation.alignment;
          local_d8.record.data.allocation.returnedPtr = (pAVar4->data).allocation.returnedPtr;
          local_d8.record.data.reallocation.returnedPtr = (pAVar4->data).reallocation.returnedPtr;
          local_d8.isLive = true;
          local_d8._49_3_ = 0;
          iVar28._M_current =
               (results->violations).
               super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar28._M_current !=
              (results->violations).
              super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00a34f4b;
          std::
          vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
          ::_M_realloc_insert<vk::AllocationCallbackViolation>
                    (local_a0,iVar28,(AllocationCallbackViolation *)&local_d8);
        }
      }
      uVar30 = uVar30 + 1;
      pBVar27 = local_78;
      if (uVar30 == local_38) {
        uVar30 = 0;
        pBVar27 = local_78->next;
      }
    } while ((pBVar27 != (recorder->m_records).m_last) ||
            (pAVar26 = local_98.
                       super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                       ._M_impl.super__Vector_impl_data._M_start,
            pAVar14 = local_98.
                      super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            pAVar15 = local_98.
                      super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
            uVar30 != (recorder->m_records).m_numElements % (recorder->m_records).m_blockSize));
  }
  for (; pAVar18 = local_98.
                   super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
      pAVar17 = local_98.
                super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                ._M_impl.super__Vector_impl_data._M_start,
      local_98.
      super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
      ._M_impl.super__Vector_impl_data._M_start = pAVar14,
      pAVar26 !=
      local_98.
      super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
      ._M_impl.super__Vector_impl_data._M_finish; pAVar26 = pAVar26 + 1) {
    local_98.
    super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
    ._M_impl.super__Vector_impl_data._M_finish = pAVar15;
    if (pAVar26->isLive == true) {
      __position._M_current =
           (results->liveAllocations).
           super__Vector_base<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (results->liveAllocations).
          super__Vector_base<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<vk::AllocationCallbackRecord,std::allocator<vk::AllocationCallbackRecord>>::
        _M_realloc_insert<vk::AllocationCallbackRecord_const&>
                  ((vector<vk::AllocationCallbackRecord,std::allocator<vk::AllocationCallbackRecord>>
                    *)results,__position,&pAVar26->record);
      }
      else {
        TVar7 = (pAVar26->record).type;
        uVar16 = *(undefined4 *)&(pAVar26->record).field_0x4;
        sVar23 = (pAVar26->record).data.allocation.size;
        sVar11 = (pAVar26->record).data.allocation.alignment;
        sVar12 = (pAVar26->record).data.reallocation.alignment;
        pvVar9 = (pAVar26->record).data.reallocation.returnedPtr;
        ((__position._M_current)->data).allocation.returnedPtr =
             (pAVar26->record).data.allocation.returnedPtr;
        ((__position._M_current)->data).reallocation.returnedPtr = pvVar9;
        ((__position._M_current)->data).allocation.alignment = sVar11;
        ((__position._M_current)->data).reallocation.alignment = sVar12;
        (__position._M_current)->type = TVar7;
        *(undefined4 *)&(__position._M_current)->field_0x4 = uVar16;
        ((__position._M_current)->data).allocation.size = sVar23;
        ppAVar3 = &(results->liveAllocations).
                   super__Vector_base<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar3 = *ppAVar3 + 1;
        local_98.
        super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
        ._M_impl.super__Vector_impl_data._M_start = pAVar14;
      }
    }
    pAVar14 = local_98.
              super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pAVar15 = local_98.
              super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_98.
    super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
    ._M_impl.super__Vector_impl_data._M_finish = pAVar18;
    local_98.
    super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
    ._M_impl.super__Vector_impl_data._M_start = pAVar17;
  }
  local_98.
  super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
  ._M_impl.super__Vector_impl_data._M_finish = pAVar15;
  std::
  _Rb_tree<void_*,_std::pair<void_*const,_unsigned_long>,_std::_Select1st<std::pair<void_*const,_unsigned_long>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ::~_Rb_tree(&local_70);
  if (pAVar17 != (pointer)0x0) {
    operator_delete(pAVar17,(long)local_98.
                                  super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pAVar17
                   );
  }
  return;
}

Assistant:

void validateAllocationCallbacks (const AllocationCallbackRecorder& recorder, AllocationCallbackValidationResults* results)
{
	std::vector<AllocationSlot>		allocations;
	std::map<void*, size_t>			ptrToSlotIndex;

	DE_ASSERT(results->liveAllocations.empty() && results->violations.empty());

	for (AllocationCallbackRecorder::RecordIterator callbackIter = recorder.getRecordsBegin();
		 callbackIter != recorder.getRecordsEnd();
		 ++callbackIter)
	{
		const AllocationCallbackRecord&		record	= *callbackIter;

		// Validate scope
		{
			const VkSystemAllocationScope* const	scopePtr	= record.type == AllocationCallbackRecord::TYPE_ALLOCATION			? &record.data.allocation.scope
																: record.type == AllocationCallbackRecord::TYPE_REALLOCATION		? &record.data.reallocation.scope
																: record.type == AllocationCallbackRecord::TYPE_INTERNAL_ALLOCATION	? &record.data.internalAllocation.scope
																: record.type == AllocationCallbackRecord::TYPE_INTERNAL_FREE		? &record.data.internalAllocation.scope
																: DE_NULL;

			if (scopePtr && !de::inBounds(*scopePtr, (VkSystemAllocationScope)0, VK_SYSTEM_ALLOCATION_SCOPE_LAST))
				results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_INVALID_ALLOCATION_SCOPE));
		}

		// Validate alignment
		if (record.type == AllocationCallbackRecord::TYPE_ALLOCATION ||
			record.type == AllocationCallbackRecord::TYPE_REALLOCATION)
		{
			if (!deIsPowerOfTwoSize(getAlignment(record)))
				results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_INVALID_ALIGNMENT));
		}

		// Validate actual allocation behavior
		switch (record.type)
		{
			case AllocationCallbackRecord::TYPE_ALLOCATION:
			{
				if (record.data.allocation.returnedPtr)
				{
					if (!de::contains(ptrToSlotIndex, record.data.allocation.returnedPtr))
					{
						ptrToSlotIndex[record.data.allocation.returnedPtr] = allocations.size();
						allocations.push_back(AllocationSlot(record, true));
					}
					else
					{
						const size_t		slotNdx		= ptrToSlotIndex[record.data.allocation.returnedPtr];
						if (!allocations[slotNdx].isLive)
						{
							allocations[slotNdx].isLive = true;
							allocations[slotNdx].record = record;
						}
						else
						{
							// we should not have multiple live allocations with the same pointer
							DE_ASSERT(false);
						}
					}
				}

				break;
			}

			case AllocationCallbackRecord::TYPE_REALLOCATION:
			{
				if (de::contains(ptrToSlotIndex, record.data.reallocation.original))
				{
					const size_t		origSlotNdx		= ptrToSlotIndex[record.data.reallocation.original];
					AllocationSlot&		origSlot		= allocations[origSlotNdx];

					DE_ASSERT(record.data.reallocation.original != DE_NULL);

					if (record.data.reallocation.size > 0)
					{
						if (getAlignment(origSlot.record) != record.data.reallocation.alignment)
							results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_REALLOC_DIFFERENT_ALIGNMENT));

						if (record.data.reallocation.original == record.data.reallocation.returnedPtr)
						{
							if (!origSlot.isLive)
							{
								results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_REALLOC_FREED_PTR));
								origSlot.isLive	= true; // Mark live to suppress further errors
							}

							// Just update slot record
							allocations[origSlotNdx].record = record;
						}
						else
						{
							if (record.data.reallocation.returnedPtr)
							{
								allocations[origSlotNdx].isLive = false;
								if (!de::contains(ptrToSlotIndex, record.data.reallocation.returnedPtr))
								{
									ptrToSlotIndex[record.data.reallocation.returnedPtr] = allocations.size();
									allocations.push_back(AllocationSlot(record, true));
								}
								else
								{
									const size_t slotNdx = ptrToSlotIndex[record.data.reallocation.returnedPtr];
									if (!allocations[slotNdx].isLive)
									{
										allocations[slotNdx].isLive = true;
										allocations[slotNdx].record = record;
									}
									else
									{
										// we should not have multiple live allocations with the same pointer
										DE_ASSERT(false);
									}
								}
							}
							// else original ptr remains valid and live
						}
					}
					else
					{
						DE_ASSERT(!record.data.reallocation.returnedPtr);

						origSlot.isLive = false;
					}
				}
				else
				{
					if (record.data.reallocation.original)
						results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_REALLOC_NOT_ALLOCATED_PTR));

					if (record.data.reallocation.returnedPtr)
					{
						if (!de::contains(ptrToSlotIndex, record.data.reallocation.returnedPtr))
						{
							ptrToSlotIndex[record.data.reallocation.returnedPtr] = allocations.size();
							allocations.push_back(AllocationSlot(record, true));
						}
						else
						{
							const size_t slotNdx = ptrToSlotIndex[record.data.reallocation.returnedPtr];
							DE_ASSERT(!allocations[slotNdx].isLive);
							allocations[slotNdx].isLive = true;
							allocations[slotNdx].record = record;
						}
					}
				}

				break;
			}

			case AllocationCallbackRecord::TYPE_FREE:
			{
				if (record.data.free.mem != DE_NULL) // Freeing null pointer is valid and ignored
				{
					if (de::contains(ptrToSlotIndex, record.data.free.mem))
					{
						const size_t	slotNdx		= ptrToSlotIndex[record.data.free.mem];

						if (allocations[slotNdx].isLive)
							allocations[slotNdx].isLive = false;
						else
							results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_DOUBLE_FREE));
					}
					else
						results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_FREE_NOT_ALLOCATED_PTR));
				}

				break;
			}

			case AllocationCallbackRecord::TYPE_INTERNAL_ALLOCATION:
			case AllocationCallbackRecord::TYPE_INTERNAL_FREE:
			{
				if (de::inBounds(record.data.internalAllocation.type, (VkInternalAllocationType)0, VK_INTERNAL_ALLOCATION_TYPE_LAST))
				{
					size_t* const		totalAllocSizePtr	= &results->internalAllocationTotal[record.data.internalAllocation.type][record.data.internalAllocation.scope];
					const size_t		size				= record.data.internalAllocation.size;

					if (record.type == AllocationCallbackRecord::TYPE_INTERNAL_FREE)
					{
						if (*totalAllocSizePtr < size)
						{
							results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_NEGATIVE_INTERNAL_ALLOCATION_TOTAL));
							*totalAllocSizePtr = 0; // Reset to 0 to suppress compound errors
						}
						else
							*totalAllocSizePtr -= size;
					}
					else
						*totalAllocSizePtr += size;
				}
				else
					results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_INVALID_INTERNAL_ALLOCATION_TYPE));

				break;
			}

			default:
				DE_ASSERT(false);
		}
	}

	DE_ASSERT(!de::contains(ptrToSlotIndex, DE_NULL));

	// Collect live allocations
	for (std::vector<AllocationSlot>::const_iterator slotIter = allocations.begin();
		 slotIter != allocations.end();
		 ++slotIter)
	{
		if (slotIter->isLive)
			results->liveAllocations.push_back(slotIter->record);
	}
}